

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<crnlib::vector<crnlib::mip_level_*>_>::vector
          (vector<crnlib::vector<crnlib::mip_level_*>_> *this,uint n,
          vector<crnlib::mip_level_*> *init)

{
  this->m_p = (vector<crnlib::mip_level_*> *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  increase_capacity(this,n,false,false);
  helpers::construct_array<crnlib::vector<crnlib::mip_level*>,crnlib::vector<crnlib::mip_level*>>
            (this->m_p,n,init);
  this->m_size = n;
  return;
}

Assistant:

inline vector(uint n, const T& init)
      : m_p(NULL),
        m_size(0),
        m_capacity(0) {
    increase_capacity(n, false);
    helpers::construct_array(m_p, n, init);
    m_size = n;
  }